

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_publish(fio_publish_args_s args)

{
  uintptr_t *puVar1;
  fio_str_info_s ch;
  fio_str_info_s ch_00;
  fio_str_info_s ch_01;
  fio_str_info_s ch_02;
  fio_str_info_s fVar2;
  fio_str_info_s data;
  fio_str_info_s data_00;
  fio_str_info_s data_01;
  fio_str_info_s data_02;
  fio_str_info_s fVar3;
  fio_msg_internal_s *pfVar4;
  size_t sVar5;
  fio_pubsub_engine_s *pfVar6;
  fio_pubsub_engine_s *in_stack_00000008;
  int in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  char *in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  char *in_stack_00000040;
  uint8_t in_stack_00000048;
  undefined4 local_78 [2];
  size_t local_70;
  size_t sStack_68;
  char *local_60;
  size_t local_58;
  size_t sStack_50;
  char *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 local_30;
  
  pfVar6 = (fio_pubsub_engine_s *)&DAT_00000001;
  if ((in_stack_00000008 == (fio_pubsub_engine_s *)0x0 && in_stack_00000010 != 0) ||
     (pfVar6 = FIO_PUBSUB_DEFAULT, in_stack_00000008 == (fio_pubsub_engine_s *)0x0)) {
    in_stack_00000008 = pfVar6;
  }
  switch(in_stack_00000008) {
  case (fio_pubsub_engine_s *)0x0:
  case (fio_pubsub_engine_s *)0x1:
    ch.len = in_stack_00000020;
    ch.capa = in_stack_00000018;
    ch.data = in_stack_00000028;
    data.len = in_stack_00000038;
    data.capa = in_stack_00000030;
    data.data = in_stack_00000040;
    pfVar4 = fio_msg_internal_create
                       (in_stack_00000010,(uint)(in_stack_00000048 != '\0'),ch,data,
                        in_stack_00000048,'\x01');
    fio_send2cluster(pfVar4);
    break;
  case (fio_pubsub_engine_s *)0x2:
    ch_01.len = in_stack_00000020;
    ch_01.capa = in_stack_00000018;
    ch_01.data = in_stack_00000028;
    data_01.len = in_stack_00000038;
    data_01.capa = in_stack_00000030;
    data_01.data = in_stack_00000040;
    pfVar4 = fio_msg_internal_create(in_stack_00000010,0,ch_01,data_01,in_stack_00000048,'\x01');
    break;
  case (fio_pubsub_engine_s *)0x3:
    ch_02.len = in_stack_00000020;
    ch_02.capa = in_stack_00000018;
    ch_02.data = in_stack_00000028;
    data_02.len = in_stack_00000038;
    data_02.capa = in_stack_00000030;
    data_02.data = in_stack_00000040;
    pfVar4 = fio_msg_internal_create
                       (in_stack_00000010,(uint)(in_stack_00000048 != '\0'),ch_02,data_02,
                        in_stack_00000048,'\x01');
    fio_send2cluster(pfVar4);
    LOCK();
    puVar1 = &pfVar4->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if (*puVar1 != 0) {
      return;
    }
    sVar5 = pfVar4->meta_len;
    if (sVar5 != 0) {
      do {
        pfVar4->meta_len = sVar5 - 1;
        if (*(long *)(&pfVar4->filter + sVar5 * 6) != 0) {
          local_78[0] = 0;
          local_60 = (pfVar4->channel).data;
          local_70 = (pfVar4->channel).capa;
          sStack_68 = (pfVar4->channel).len;
          local_48 = (pfVar4->data).data;
          local_58 = (pfVar4->data).capa;
          sStack_50 = (pfVar4->data).len;
          local_40 = 0;
          uStack_38 = 0;
          local_30 = 0;
          (**(code **)(&pfVar4->filter + sVar5 * 6))(local_78,(&pfVar4->meta_len)[sVar5 * 3]);
        }
        sVar5 = pfVar4->meta_len;
      } while (sVar5 != 0);
    }
    fio_free(pfVar4);
    return;
  case (fio_pubsub_engine_s *)0x4:
    ch_00.len = in_stack_00000020;
    ch_00.capa = in_stack_00000018;
    ch_00.data = in_stack_00000028;
    data_00.len = in_stack_00000038;
    data_00.capa = in_stack_00000030;
    data_00.data = in_stack_00000040;
    pfVar4 = fio_msg_internal_create
                       (in_stack_00000010,3 - (in_stack_00000048 == '\0'),ch_00,data_00,
                        in_stack_00000048,'\x01');
    if ((fio_data->is_worker != '\0') && (fio_data->workers != 1)) {
      fio_cluster_client_sender(pfVar4,-1);
      return;
    }
    break;
  default:
    if (in_stack_00000010 == 0) {
      fVar2.len = in_stack_00000020;
      fVar2.capa = in_stack_00000018;
      fVar2.data = in_stack_00000028;
      fVar3.len = in_stack_00000038;
      fVar3.capa = in_stack_00000030;
      fVar3.data = in_stack_00000040;
      (*in_stack_00000008->publish)(in_stack_00000008,fVar2,fVar3,in_stack_00000048);
    }
    else if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "ERROR: (pub/sub) pub/sub engines can only be used for pub/sub messages (no filter)."
                    );
      return;
    }
    return;
  }
  fio_publish2process(pfVar4);
  return;
}

Assistant:

void fio_publish FIO_IGNORE_MACRO(fio_publish_args_s args) {
  if (args.filter && !args.engine) {
    args.engine = FIO_PUBSUB_CLUSTER;
  } else if (!args.engine) {
    args.engine = FIO_PUBSUB_DEFAULT;
  }
  fio_msg_internal_s *m = NULL;
  switch ((uintptr_t)args.engine) {
  case 0UL: /* fallthrough (missing default) */
  case 1UL: // ((uintptr_t)FIO_PUBSUB_CLUSTER):
    m = fio_msg_internal_create(
        args.filter,
        (args.is_json ? FIO_CLUSTER_MSG_JSON : FIO_CLUSTER_MSG_FORWARD),
        args.channel, args.message, args.is_json, 1);
    fio_send2cluster(m);
    fio_publish2process(m);
    break;
  case 2UL: // ((uintptr_t)FIO_PUBSUB_PROCESS):
    m = fio_msg_internal_create(args.filter, 0, args.channel, args.message,
                                args.is_json, 1);
    fio_publish2process(m);
    break;
  case 3UL: // ((uintptr_t)FIO_PUBSUB_SIBLINGS):
    m = fio_msg_internal_create(
        args.filter,
        (args.is_json ? FIO_CLUSTER_MSG_JSON : FIO_CLUSTER_MSG_FORWARD),
        args.channel, args.message, args.is_json, 1);
    fio_send2cluster(m);
    fio_msg_internal_free(m);
    m = NULL;
    break;
  case 4UL: // ((uintptr_t)FIO_PUBSUB_ROOT):
    m = fio_msg_internal_create(
        args.filter,
        (args.is_json ? FIO_CLUSTER_MSG_ROOT_JSON : FIO_CLUSTER_MSG_ROOT),
        args.channel, args.message, args.is_json, 1);
    if (fio_data->is_worker == 0 || fio_data->workers == 1) {
      fio_publish2process(m);
    } else {
      fio_cluster_client_sender(m, -1);
    }
    break;
  default:
    if (args.filter != 0) {
      FIO_LOG_ERROR("(pub/sub) pub/sub engines can only be used for "
                    "pub/sub messages (no filter).");
      return;
    }
    args.engine->publish(args.engine, args.channel, args.message, args.is_json);
  }
  return;
}